

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  _func_void_PyObject_ptr_void_ptr *p_Var1;
  undefined8 uVar2;
  handle hVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined8 *puVar7;
  PyObject *pPVar8;
  unsigned_long *puVar9;
  PyObject *pPVar10;
  reference pvVar11;
  type_error *this;
  PyObject **ppPVar12;
  size_type sVar13;
  reference pfVar14;
  handle *phVar15;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  size_t sVar21;
  undefined8 uVar22;
  type_info *ptVar23;
  bool bVar24;
  reference rVar25;
  bool local_5c1;
  PyTypeObject *local_560;
  type_info *tinfo;
  string local_548 [8];
  string msg_1;
  handle local_508;
  PyObject *local_500;
  str local_4f8;
  string local_4f0;
  ulong local_4d0;
  size_t ti;
  tuple local_4c0;
  tuple args_;
  size_t ret;
  size_t next;
  size_t end;
  size_t start;
  string local_490 [8];
  string sig;
  undefined1 local_468 [7];
  bool wrote_sig;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  undefined8 *local_408;
  function_record *it2;
  int ctr;
  allocator local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_370 [8];
  string msg;
  error_already_set *e;
  _func_void_exception_ptr **translator;
  iterator __end3_1;
  iterator __begin3_1;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *__range3_1;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *registered_exception_translators;
  exception_ptr last_exception;
  reference_cast_error *anon_var_0_1;
  function_call *call_1;
  iterator __end3;
  iterator __begin3;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  *__range3;
  _Bit_type local_2c0;
  PyObject *local_2b8;
  size_t i_1;
  reference_cast_error *anon_var_0;
  undefined1 local_298 [8];
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  tuple_accessor local_268;
  PyObject *local_248;
  handle local_240;
  handle item;
  size_t i;
  PyObject *local_228;
  size_t args_size;
  handle local_218;
  tuple local_210;
  value_type local_208;
  tuple extra_args;
  handle local_1f8;
  dict local_1f0;
  handle local_1e8;
  handle local_1e0;
  handle value_1;
  value_type *arg;
  handle hStack_1c8;
  bool copied_kwargs;
  handle local_1c0;
  dict kwargs;
  allocator local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  handle local_100;
  handle value;
  size_t args_copied;
  size_t args_to_copy;
  undefined1 local_d0 [8];
  function_call call;
  size_t pos_args;
  function_record *func;
  undefined1 local_68 [7];
  bool overloaded;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  handle result;
  handle parent;
  size_t n_args_in;
  function_record *it;
  function_record *overloads;
  PyObject *kwargs_in_local;
  PyObject *args_in_local;
  PyObject *self_local;
  
  puVar7 = (undefined8 *)PyCapsule_GetPointer(self,0);
  iVar6 = PyType_HasFeature(args_in->ob_type,0x4000000);
  if (iVar6 == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                  ,0x189,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  parent.m_ptr = (PyObject *)args_in[1].ob_refcnt;
  if (parent.m_ptr == (PyObject *)0x0) {
    local_560 = (PyTypeObject *)0x0;
  }
  else {
    iVar6 = PyType_HasFeature(args_in->ob_type,0x4000000);
    if (iVar6 == 0) {
      __assert_fail("PyTuple_Check(args_in)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                    ,0x18b,
                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                   );
    }
    local_560 = args_in[1].ob_type;
  }
  handle::handle(&result,(PyObject *)local_560);
  handle::handle((handle *)
                 &second_pass.
                  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(PyObject *)0x1);
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          *)local_68);
  bVar24 = false;
  n_args_in = (size_t)puVar7;
  if (puVar7 != (undefined8 *)0x0) {
    bVar24 = puVar7[0xf] != 0;
  }
  for (; n_args_in != 0; n_args_in = *(size_t *)(n_args_in + 0x78)) {
    call.parent.m_ptr = (PyObject *)(ulong)*(ushort *)(n_args_in + 0x5a);
    if ((*(byte *)(n_args_in + 0x59) >> 3 & 1) != 0) {
      call.parent.m_ptr = (PyObject *)((long)&call.parent.m_ptr[-1].ob_type + 7);
    }
    if ((*(byte *)(n_args_in + 0x59) >> 4 & 1) != 0) {
      call.parent.m_ptr = (PyObject *)((long)&call.parent.m_ptr[-1].ob_type + 7);
    }
    if ((((*(byte *)(n_args_in + 0x59) >> 3 & 1) != 0) || (parent.m_ptr <= call.parent.m_ptr)) &&
       ((call.parent.m_ptr <= parent.m_ptr ||
        (pPVar8 = (PyObject *)
                  std::
                  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                          *)(n_args_in + 0x18)), call.parent.m_ptr <= pPVar8)))) {
      detail::function_call::function_call
                ((function_call *)local_d0,(function_record *)n_args_in,result);
      puVar9 = std::min<unsigned_long>((unsigned_long *)&call.parent,(unsigned_long *)&parent);
      pPVar8 = (PyObject *)*puVar9;
      for (value.m_ptr = (PyObject *)0x0; hVar3.m_ptr = value.m_ptr, value.m_ptr < pPVar8;
          value.m_ptr = (PyObject *)((long)&(value.m_ptr)->ob_refcnt + 1)) {
        if (((kwargs_in != (PyObject *)0x0) &&
            (pPVar10 = (PyObject *)
                       std::
                       vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                               *)(n_args_in + 0x18)), hVar3.m_ptr < pPVar10)) &&
           (pvVar11 = std::
                      vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                      ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                    *)(n_args_in + 0x18),(size_type)value.m_ptr),
           *(long *)pvVar11 != 0)) {
          pvVar11 = std::
                    vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                    ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                  *)(n_args_in + 0x18),(size_type)value.m_ptr);
          pPVar10 = (PyObject *)PyDict_GetItemString(kwargs_in,*(undefined8 *)pvVar11);
          handle::handle(&local_100,pPVar10);
          bVar4 = handle::operator_cast_to_bool(&local_100);
          if (bVar4) {
            this = (type_error *)__cxa_allocate_exception(0x10);
            pcVar16 = *(char **)n_args_in;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_180,pcVar16,&local_181);
            std::operator+(&local_160,&local_180,"(): got multiple values for argument \'");
            pvVar11 = std::
                      vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                      ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                    *)(n_args_in + 0x18),(size_type)value.m_ptr);
            pcVar16 = *(char **)pvVar11;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1a8,pcVar16,&local_1a9);
            std::operator+(&local_140,&local_160,&local_1a8);
            std::operator+(&local_120,&local_140,"\'");
            type_error::runtime_error(this,&local_120);
            __cxa_throw(this,&type_error::typeinfo,type_error::~type_error);
          }
        }
        iVar6 = PyType_HasFeature(args_in->ob_type,0x4000000);
        if (iVar6 == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                        ,0x1ca,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        handle::handle((handle *)&kwargs,(PyObject *)(&args_in[1].ob_type)[(long)value.m_ptr]);
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,
                   (value_type *)&kwargs);
        hVar3 = value;
        pPVar10 = (PyObject *)
                  std::
                  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                          *)(n_args_in + 0x18));
        if (hVar3.m_ptr < pPVar10) {
          pvVar11 = std::
                    vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                    ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                  *)(n_args_in + 0x18),(size_type)value.m_ptr);
          local_5c1 = (bool)((byte)pvVar11[0x18] & 1);
        }
        else {
          local_5c1 = true;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)
                   &call.args.
                    super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_5c1);
      }
      handle::handle(&stack0xfffffffffffffe38,kwargs_in);
      reinterpret_borrow<pybind11::dict>((pybind11 *)&local_1c0,hStack_1c8);
      if (value.m_ptr < call.parent.m_ptr) {
        bVar4 = false;
        for (; value.m_ptr < call.parent.m_ptr;
            value.m_ptr = (PyObject *)((long)&(value.m_ptr)->ob_refcnt + 1)) {
          value_1.m_ptr =
               (PyObject *)
               std::
               vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                             *)(n_args_in + 0x18),value.m_ptr);
          handle::handle(&local_1e0);
          if ((kwargs_in != (PyObject *)0x0) && ((value_1.m_ptr)->ob_refcnt != 0)) {
            ppPVar12 = handle::ptr(&local_1c0);
            pPVar10 = (PyObject *)PyDict_GetItemString(*ppPVar12,(value_1.m_ptr)->ob_refcnt);
            handle::handle(&local_1e8,pPVar10);
            local_1e0.m_ptr = local_1e8.m_ptr;
          }
          bVar5 = handle::operator_cast_to_bool(&local_1e0);
          if (bVar5) {
            if (!bVar4) {
              ppPVar12 = handle::ptr(&local_1c0);
              pPVar10 = (PyObject *)PyDict_Copy(*ppPVar12);
              handle::handle(&local_1f8,pPVar10);
              reinterpret_steal<pybind11::dict>((pybind11 *)&local_1f0,local_1f8);
              dict::operator=((dict *)&local_1c0,&local_1f0);
              dict::~dict(&local_1f0);
              bVar4 = true;
            }
            ppPVar12 = handle::ptr(&local_1c0);
            PyDict_DelItemString(*ppPVar12,(value_1.m_ptr)->ob_refcnt);
          }
          else {
            bVar5 = handle::operator_cast_to_bool((handle *)(value_1.m_ptr + 1));
            if (bVar5) {
              local_1e0.m_ptr = (PyObject *)value_1.m_ptr[1].ob_refcnt;
            }
          }
          bVar5 = handle::operator_cast_to_bool(&local_1e0);
          if (!bVar5) break;
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,&local_1e0
                    );
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)
                     &call.args.
                      super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (bool)(*(byte *)&value_1.m_ptr[1].ob_type & 1));
        }
        if (call.parent.m_ptr <= value.m_ptr) goto LAB_00710637;
        extra_args.super_object.super_handle.m_ptr._4_4_ = 4;
      }
      else {
LAB_00710637:
        bVar4 = handle::operator_cast_to_bool(&local_1c0);
        if (((bVar4) && (sVar20 = dict::size((dict *)&local_1c0), sVar20 != 0)) &&
           ((*(byte *)(n_args_in + 0x59) >> 4 & 1) == 0)) {
          extra_args.super_object.super_handle.m_ptr._4_4_ = 4;
        }
        else {
          tuple::tuple((tuple *)&local_208,0);
          if ((*(byte *)(n_args_in + 0x59) >> 3 & 1) != 0) {
            if (pPVar8 == (PyObject *)0x0) {
              handle::handle(&local_218,args_in);
              reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_210,local_218);
              tuple::operator=((tuple *)&local_208,&local_210);
              tuple::~tuple(&local_210);
            }
            else if (value.m_ptr < parent.m_ptr) {
              local_228 = parent.m_ptr - value.m_ptr;
              tuple::tuple((tuple *)&i,(size_t)local_228);
              tuple::operator=((tuple *)&local_208,(tuple *)&i);
              tuple::~tuple((tuple *)&i);
              for (item.m_ptr = (PyObject *)0x0; item.m_ptr < local_228;
                  item.m_ptr = (PyObject *)((long)&(item.m_ptr)->ob_refcnt + 1)) {
                iVar6 = PyType_HasFeature(args_in->ob_type,0x4000000);
                if (iVar6 == 0) {
                  __assert_fail("PyTuple_Check(args_in)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                                ,0x204,
                                "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                               );
                }
                handle::handle(&local_240,
                               (PyObject *)
                               (&args_in[1].ob_type)
                               [(long)&(value.m_ptr)->ob_refcnt + (long)item.m_ptr]);
                phVar15 = handle::inc_ref(&local_240);
                local_248 = handle::ptr(phVar15);
                tuple::operator[](&local_268,(tuple *)&local_208,(size_t)item.m_ptr);
                detail::accessor<pybind11::detail::accessor_policies::tuple_item>::operator=
                          (&local_268,&local_248);
                detail::accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor
                          (&local_268);
              }
            }
            else {
              tuple::tuple((tuple *)&args_size,0);
              tuple::operator=((tuple *)&local_208,(tuple *)&args_size);
              tuple::~tuple((tuple *)&args_size);
            }
            std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                      ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,
                       &local_208);
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)
                       &call.args.
                        super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,false);
          }
          if ((*(byte *)(n_args_in + 0x59) >> 4 & 1) != 0) {
            ppPVar12 = handle::ptr(&local_1c0);
            if (*ppPVar12 == (PyObject *)0x0) {
              dict::dict((dict *)&second_pass_convert.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_end_of_storage);
              dict::operator=((dict *)&local_1c0,
                              (dict *)&second_pass_convert.
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_end_of_storage);
              dict::~dict((dict *)&second_pass_convert.super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl.super__Bvector_impl_data._M_end_of_storage);
            }
            std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                      ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,
                       &local_1c0);
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)
                       &call.args.
                        super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,false);
          }
          sVar13 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::size
                             ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call);
          if ((sVar13 != *(ushort *)(n_args_in + 0x5a)) ||
             (sVar13 = std::vector<bool,_std::allocator<bool>_>::size
                                 ((vector<bool,_std::allocator<bool>_> *)
                                  &call.args.
                                   super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage),
             sVar13 != *(ushort *)(n_args_in + 0x5a))) {
            pybind11_fail(
                         "Internal error: function call dispatcher inserted wrong number of arguments!"
                         );
          }
          std::vector<bool,_std::allocator<bool>_>::vector
                    ((vector<bool,_std::allocator<bool>_> *)local_298);
          if (bVar24) {
            std::vector<bool,_std::allocator<bool>_>::resize
                      ((vector<bool,_std::allocator<bool>_> *)local_298,
                       (ulong)*(ushort *)(n_args_in + 0x5a),false);
            std::vector<bool,_std::allocator<bool>_>::swap
                      ((vector<bool,_std::allocator<bool>_> *)
                       &call.args.
                        super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<bool,_std::allocator<bool>_> *)local_298);
          }
          anon_var_0 = (reference_cast_error *)(**(code **)(n_args_in + 0x30))(local_d0);
          second_pass.
          super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_0;
          ppPVar12 = handle::ptr((handle *)
                                 &second_pass.
                                  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (*ppPVar12 == (PyObject *)0x1) {
            if (bVar24) {
              for (local_2b8 = (PyObject *)
                               (long)(int)(uint)((*(byte *)(n_args_in + 0x59) >> 5 & 1) != 0);
                  local_2b8 < call.parent.m_ptr;
                  local_2b8 = (PyObject *)((long)&local_2b8->ob_refcnt + 1)) {
                rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)local_298,
                                    (size_type)local_2b8);
                local_2c0 = rVar25._M_mask;
                __range3 = (vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                            *)rVar25._M_p;
                bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range3);
                if (bVar4) {
                  std::vector<bool,_std::allocator<bool>_>::swap
                            ((vector<bool,_std::allocator<bool>_> *)
                             &call.args.
                              super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<bool,_std::allocator<bool>_> *)local_298);
                  std::
                  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                  ::push_back((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                               *)local_68,(value_type *)local_d0);
                  break;
                }
              }
            }
            extra_args.super_object.super_handle.m_ptr._4_4_ = 0;
          }
          else {
            extra_args.super_object.super_handle.m_ptr._4_4_ = 2;
          }
          std::vector<bool,_std::allocator<bool>_>::~vector
                    ((vector<bool,_std::allocator<bool>_> *)local_298);
          tuple::~tuple((tuple *)&local_208);
        }
      }
      dict::~dict((dict *)&local_1c0);
      detail::function_call::~function_call((function_call *)local_d0);
      if ((extra_args.super_object.super_handle.m_ptr._4_4_ != 0) &&
         (extra_args.super_object.super_handle.m_ptr._4_4_ == 2)) break;
    }
  }
  if (((bVar24) &&
      (bVar24 = std::
                vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                ::empty((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                         *)local_68), !bVar24)) &&
     (ppPVar12 = handle::ptr((handle *)
                             &second_pass.
                              super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage),
     *ppPVar12 == (PyObject *)0x1)) {
    __end3 = std::
             vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             ::begin((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                      *)local_68);
    call_1 = (function_call *)
             std::
             vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             ::end((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                    *)local_68);
    while (bVar24 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<pybind11::detail::function_call_*,_std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>_>
                                        *)&call_1), bVar24) {
      pfVar14 = __gnu_cxx::
                __normal_iterator<pybind11::detail::function_call_*,_std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>_>
                ::operator*(&__end3);
      second_pass.
      super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(*pfVar14->func->impl)(pfVar14);
      ppPVar12 = handle::ptr((handle *)
                             &second_pass.
                              super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (*ppPVar12 != (PyObject *)0x1) break;
      __gnu_cxx::
      __normal_iterator<pybind11::detail::function_call_*,_std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>_>
      ::operator++(&__end3);
    }
  }
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
           *)local_68);
  ppPVar12 = handle::ptr((handle *)
                         &second_pass.
                          super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (*ppPVar12 == (PyObject *)0x1) {
    if ((*(byte *)((long)puVar7 + 0x59) >> 2 & 1) == 0) {
      pcVar16 = (char *)*puVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3d0,pcVar16,&local_3d1);
      std::operator+(&local_3b0,&local_3d0,"(): incompatible ");
      pcVar16 = "function";
      if ((*(byte *)((long)puVar7 + 0x59) & 1) != 0) {
        pcVar16 = "constructor";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&ctr,pcVar16,(allocator *)((long)&it2 + 7));
      std::operator+(&local_390,&local_3b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ctr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                     &local_390," arguments. The following argument types are supported:\n");
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&ctr);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it2 + 7));
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      it2._0_4_ = 0;
      for (local_408 = puVar7; local_408 != (undefined8 *)0x0;
          local_408 = (undefined8 *)local_408[0xf]) {
        it2._0_4_ = (int)it2 + 1;
        std::__cxx11::to_string((string *)local_468,(int)it2);
        std::operator+(&local_448,"    ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_468);
        std::operator+(&local_428,&local_448,". ");
        std::__cxx11::string::operator+=((string *)local_370,(string *)&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)local_468);
        sig.field_2._M_local_buf[0xf] = '\0';
        if ((*(byte *)((long)puVar7 + 0x59) & 1) != 0) {
          pcVar16 = (char *)local_408[2];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_490,pcVar16,(allocator *)((long)&start + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
          lVar17 = std::__cxx11::string::find((char)local_490,0x28);
          uVar18 = lVar17 + 7;
          uVar19 = std::__cxx11::string::size();
          if (uVar18 < uVar19) {
            next = std::__cxx11::string::find((char *)local_490,0xbbeb10);
            ret = next + 2;
            args_.super_object.super_handle.m_ptr =
                 (object)std::__cxx11::string::rfind((char *)local_490,0xb7da68);
            uVar19 = std::__cxx11::string::size();
            if (uVar19 <= next) {
              ret = std::__cxx11::string::find((char)local_490,0x29);
              next = ret;
            }
            if ((uVar18 < next) && (uVar19 = std::__cxx11::string::size(), ret < uVar19)) {
              std::__cxx11::string::append((string *)local_370,(ulong)local_490,uVar18);
              std::__cxx11::string::operator+=((string *)local_370,'(');
              std::__cxx11::string::append((string *)local_370,(ulong)local_490,ret);
              sig.field_2._M_local_buf[0xf] = '\x01';
            }
          }
          std::__cxx11::string::~string(local_490);
        }
        if ((sig.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::__cxx11::string::operator+=((string *)local_370,(char *)local_408[2]);
        }
        std::__cxx11::string::operator+=((string *)local_370,"\n");
      }
      std::__cxx11::string::operator+=((string *)local_370,"\nInvoked with: ");
      handle::handle((handle *)&ti,args_in);
      reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_4c0,(handle)ti);
      for (local_4d0 = (ulong)(int)(uint)((*(byte *)((long)puVar7 + 0x59) & 1) != 0);
          uVar18 = local_4d0, sVar20 = tuple::size(&local_4c0), uVar2 = _PyExc_TypeError,
          uVar18 < sVar20; local_4d0 = local_4d0 + 1) {
        tuple::operator[]((tuple_accessor *)((long)&msg_1.field_2 + 8),&local_4c0,local_4d0);
        detail::accessor::operator_cast_to_object((accessor *)&local_508);
        local_500 = local_508.m_ptr;
        repr((pybind11 *)&local_4f8,local_508);
        pybind11::str::operator_cast_to_string(&local_4f0,&local_4f8);
        std::__cxx11::string::operator+=((string *)local_370,(string *)&local_4f0);
        std::__cxx11::string::~string((string *)&local_4f0);
        pybind11::str::~str(&local_4f8);
        pybind11::object::~object((object *)&local_508);
        detail::accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor
                  ((accessor<pybind11::detail::accessor_policies::tuple_item> *)
                   ((long)&msg_1.field_2 + 8));
        sVar20 = local_4d0 + 1;
        sVar21 = tuple::size(&local_4c0);
        if (sVar20 != sVar21) {
          std::__cxx11::string::operator+=((string *)local_370,", ");
        }
      }
      uVar22 = std::__cxx11::string::c_str();
      PyErr_SetString(uVar2,uVar22);
      self_local = (PyObject *)0x0;
      extra_args.super_object.super_handle.m_ptr._4_4_ = 1;
      tuple::~tuple(&local_4c0);
      std::__cxx11::string::~string((string *)local_370);
    }
    else {
      handle::handle((handle *)((long)&msg.field_2 + 8),(PyObject *)&_Py_NotImplementedStruct);
      phVar15 = handle::inc_ref((handle *)((long)&msg.field_2 + 8));
      self_local = handle::ptr(phVar15);
    }
  }
  else {
    bVar24 = handle::operator_cast_to_bool
                       ((handle *)
                        &second_pass.
                         super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar24) {
      if ((*(byte *)((long)puVar7 + 0x59) & 1) != 0) {
        ppPVar12 = handle::ptr(&result);
        ptVar23 = detail::get_type_info((*ppPVar12)->ob_type);
        p_Var1 = ptVar23->init_holder;
        ppPVar12 = handle::ptr(&result);
        (*p_Var1)(*ppPVar12,(void *)0x0);
      }
      ppPVar12 = handle::ptr((handle *)
                             &second_pass.
                              super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      self_local = *ppPVar12;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_548,
                 "Unable to convert function return value to a Python type! The signature was\n\t",
                 (allocator *)((long)&tinfo + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&tinfo + 7));
      std::__cxx11::string::operator+=(local_548,*(char **)(n_args_in + 0x10));
      uVar2 = _PyExc_TypeError;
      uVar22 = std::__cxx11::string::c_str();
      PyErr_SetString(uVar2,uVar22);
      self_local = (PyObject *)0x0;
      extra_args.super_object.super_handle.m_ptr._4_4_ = 1;
      std::__cxx11::string::~string(local_548);
    }
  }
  return self_local;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                        *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = std::min(pos_args, n_args_in);
                size_t args_copied = 0;

                // 1. Copy any position arguments given.
                for (; args_copied < args_to_copy; ++args_copied) {
                    // If we find a given positional argument that also has a named kwargs argument,
                    // raise a TypeError like Python does.  (We could also continue with the next
                    // overload, but this seems highly likely to be a caller mistake rather than a
                    // legitimate overload).
                    if (kwargs_in && args_copied < func.args.size() && func.args[args_copied].name) {
                        handle value = PyDict_GetItemString(kwargs_in, func.args[args_copied].name);
                        if (value)
                            throw type_error(std::string(func.name) + "(): got multiple values for argument '" +
                                    std::string(func.args[args_copied].name) + "'");
                    }

                    call.args.push_back(PyTuple_GET_ITEM(args_in, args_copied));
                    call.args_convert.push_back(args_copied < func.args.size() ? func.args[args_copied].convert : true);
                }

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                tuple extra_args;
                if (func.has_args) {
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            handle item = PyTuple_GET_ITEM(args_in, args_copied + i);
                            extra_args[i] = item.inc_ref().ptr();
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                        break;
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                msg += pybind11::repr(args_[ti]);
                if ((ti + 1) != args_.size() )
                    msg += ", ";
            }
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                /* When a constructor ran successfully, the corresponding
                   holder type (e.g. std::unique_ptr) must still be initialized. */
                auto tinfo = get_type_info(Py_TYPE(parent.ptr()));
                tinfo->init_holder(parent.ptr(), nullptr);
            }
            return result.ptr();
        }
    }